

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O3

void __thiscall CSHA512::CSHA512(CSHA512 *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->bytes = 0;
  this->s[0] = 0x6a09e667f3bcc908;
  this->s[1] = 0xbb67ae8584caa73b;
  this->s[2] = 0x3c6ef372fe94f82b;
  this->s[3] = 0xa54ff53a5f1d36f1;
  this->s[4] = 0x510e527fade682d1;
  this->s[5] = 0x9b05688c2b3e6c1f;
  this->s[6] = 0x1f83d9abfb41bd6b;
  this->s[7] = 0x5be0cd19137e2179;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSHA512::CSHA512()
{
    sha512::Initialize(s);
}